

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotText(char *text,double x,double y,bool vertical,ImVec2 *pixel_offset)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImU32 col;
  ImDrawList *this;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float local_68;
  float fStack_64;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  ImVec2 pos;
  
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    this = GetPlotDrawList();
    PushPlotClipRect(0.0);
    local_58 = (undefined1  [16])GetStyleColorVec4(0xc);
    col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_58);
    if (vertical) {
      IVar1 = ImGui::CalcTextSize(text,(char *)0x0,false,-1.0);
      local_48._8_4_ = extraout_XMM0_Dc;
      local_48._0_4_ = IVar1.x;
      local_48._4_4_ = IVar1.y;
      local_48._12_4_ = extraout_XMM0_Dd;
      local_58._8_8_ = y;
      local_58._0_8_ = x;
      IVar2 = PlotToPixels((ImPlotPoint *)local_58,-1);
      IVar1.y = IVar2.y + (float)local_48._0_4_ * 0.5 + (*pixel_offset).y;
      IVar1.x = (IVar2.x - (float)local_48._4_4_ * 0.5) + (*pixel_offset).x;
      AddTextVertical(this,IVar1,col,text,(char *)0x0);
    }
    else {
      local_58._8_8_ = y;
      local_58._0_8_ = x;
      IVar1 = PlotToPixels((ImPlotPoint *)local_58,-1);
      IVar2 = ImGui::CalcTextSize(text,(char *)0x0,false,-1.0);
      local_68 = IVar1.x;
      fStack_64 = IVar1.y;
      pos.x = (*pixel_offset).x + IVar2.x * -0.5 + local_68;
      pos.y = (*pixel_offset).y + IVar2.y * -0.5 + fStack_64;
      ImDrawList::AddText(this,&pos,col,text,(char *)0x0);
    }
    PopPlotClipRect();
    return;
  }
  __assert_fail("(GImPlot->CurrentPlot != __null) && \"PlotText() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot_items.cpp"
                ,0x8b9,"void ImPlot::PlotText(const char *, double, double, bool, const ImVec2 &)");
}

Assistant:

void PlotText(const char* text, double x, double y, bool vertical, const ImVec2& pixel_offset) {
    IM_ASSERT_USER_ERROR(GImPlot->CurrentPlot != NULL, "PlotText() needs to be called between BeginPlot() and EndPlot()!");
    ImDrawList & DrawList = *GetPlotDrawList();
    PushPlotClipRect();
    ImU32 colTxt = GetStyleColorU32(ImPlotCol_InlayText);
    if (vertical) {
        ImVec2 ctr = CalcTextSizeVertical(text) * 0.5f;
        ImVec2 pos = PlotToPixels(ImPlotPoint(x,y)) + ImVec2(-ctr.x, ctr.y) + pixel_offset;
        AddTextVertical(&DrawList, pos, colTxt, text);
    }
    else {
        ImVec2 pos = PlotToPixels(ImPlotPoint(x,y)) - ImGui::CalcTextSize(text) * 0.5f + pixel_offset;
        DrawList.AddText(pos, colTxt, text);
    }
    PopPlotClipRect();
}